

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataManMonitor.cpp
# Opt level: O3

void __thiscall adios2::core::engine::DataManMonitor::BeginStep(DataManMonitor *this,size_t step)

{
  _Elt_pointer ptVar1;
  unsigned_long *puVar2;
  rep rVar3;
  unsigned_long *puVar4;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_10;
  
  if (step == 0) {
    rVar3 = std::chrono::_V2::system_clock::now();
    (this->m_InitialTimer).__d.__r = rVar3;
  }
  if ((this->m_StepTimers).c.
      super__Deque_base<std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      (this->m_StepTimers).c.
      super__Deque_base<std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>
      ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    local_10.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    ptVar1 = (this->m_StepTimers).c.
             super__Deque_base<std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ptVar1 == (this->m_StepTimers).c.
                  super__Deque_base<std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
      std::
      deque<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,std::allocator<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>>
      ::
      _M_push_back_aux<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>
                ((deque<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,std::allocator<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>>
                  *)&this->m_StepTimers,&local_10);
    }
    else {
      (ptVar1->__d).__r = (rep)local_10.__d.__r;
      (this->m_StepTimers).c.
      super__Deque_base<std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur = ptVar1 + 1;
    }
  }
  this->m_StepBytes = 0;
  puVar2 = (this->m_TotalBytes).c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (puVar2 == (this->m_TotalBytes).c.
                super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Deque_impl_data._M_start._M_cur) {
    local_10.__d.__r = (duration)0;
    if (puVar2 == (this->m_TotalBytes).c.
                  super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_last + -1) {
      std::deque<unsigned_long,_std::allocator<unsigned_long>_>::_M_push_back_aux<unsigned_long>
                (&(this->m_TotalBytes).c,(unsigned_long *)&local_10);
      goto LAB_0068c12f;
    }
    *puVar2 = 0;
  }
  else {
    puVar4 = puVar2;
    if (puVar2 == (this->m_TotalBytes).c.
                  super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_first) {
      puVar4 = (this->m_TotalBytes).c.
               super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    if (puVar2 == (this->m_TotalBytes).c.
                  super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_last + -1) {
      std::deque<unsigned_long,std::allocator<unsigned_long>>::
      _M_push_back_aux<unsigned_long_const&>
                ((deque<unsigned_long,std::allocator<unsigned_long>> *)&this->m_TotalBytes,
                 puVar4 + -1);
      goto LAB_0068c12f;
    }
    *puVar2 = puVar4[-1];
  }
  (this->m_TotalBytes).c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = puVar2 + 1;
LAB_0068c12f:
  this->m_CurrentStep = this->m_CurrentStep + 1;
  return;
}

Assistant:

void DataManMonitor::BeginStep(const size_t step)
{
    if (step == 0)
    {
        m_InitialTimer = std::chrono::system_clock::now();
    }
    if (m_StepTimers.empty())
    {
        m_StepTimers.push(std::chrono::system_clock::now());
    }

    m_StepBytes = 0;

    if (m_TotalBytes.empty())
    {
        m_TotalBytes.push(0);
    }
    else
    {
        m_TotalBytes.push(m_TotalBytes.back());
    }

    ++m_CurrentStep;
}